

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineBspline::ArchiveOUT(ChLineBspline *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_60;
  ChNameValue<int> local_48;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLineBspline>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_30._value = &this->points;
  local_30._name = "points";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->p;
  local_48._name = "p";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->closed;
  local_60._name = "closed";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChLineBspline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLineBspline>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    ////marchive << CHNVP(knots); //**TODO MATRIX DESERIALIZATION
    marchive << CHNVP(p);
	marchive << CHNVP(closed);
}